

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_lpf_reinit__internal(ma_lpf_config *pConfig,void *pHeap,ma_lpf *pLPF,ma_bool32 isNew)

{
  ma_format mVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar6;
  undefined4 uVar7;
  ma_lpf1 *pmVar4;
  ma_lpf2 *pmVar5;
  void *__ptr;
  int iVar8;
  ma_uint32 mVar9;
  ma_bool32 mVar10;
  uint uVar11;
  ma_result mVar12;
  uint uVar13;
  ma_result mVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  double dVar19;
  ma_lpf1_config config;
  ma_lpf_heap_layout heapLayout;
  ma_lpf1_config local_98;
  ulong local_70;
  ma_bool32 local_64;
  void *local_60;
  undefined1 local_58 [16];
  size_t local_48;
  ulong local_40;
  double local_38;
  
  if (pConfig == (ma_lpf_config *)0x0 || pLPF == (ma_lpf *)0x0) {
    return MA_INVALID_ARGS;
  }
  mVar1 = pConfig->format;
  if ((mVar1 != ma_format_f32) && (mVar1 != ma_format_s16)) {
    return MA_INVALID_ARGS;
  }
  if ((pLPF->format == ma_format_unknown || pLPF->format == mVar1) &&
     ((pLPF->channels == 0 || (pLPF->channels == pConfig->channels)))) {
    uVar13 = pConfig->order;
    if (8 < uVar13) {
      return MA_INVALID_ARGS;
    }
    uVar11 = uVar13 & 1;
    local_70 = (ulong)(uVar13 >> 1);
    if (isNew == 0) {
      if (pLPF->lpf1Count != uVar11) goto LAB_00139c15;
      mVar12 = MA_INVALID_OPERATION;
      if (pLPF->lpf2Count != uVar13 >> 1) {
        return MA_INVALID_OPERATION;
      }
      local_58 = (undefined1  [16])0x0;
      local_48 = 0;
    }
    else {
      mVar12 = ma_lpf_get_heap_layout(pConfig,(ma_lpf_heap_layout *)local_58);
      if (mVar12 != MA_SUCCESS) {
        return mVar12;
      }
      pLPF->_pHeap = pHeap;
      if (local_58._0_8_ != 0 && pHeap != (void *)0x0) {
        memset(pHeap,0,local_58._0_8_);
      }
      pLPF->pLPF1 = (ma_lpf1 *)(local_58._8_8_ + (long)pHeap);
      pLPF->pLPF2 = (ma_lpf2 *)(local_48 + (long)pHeap);
      mVar12 = MA_SUCCESS;
    }
    if (uVar11 != 0) {
      local_98.format = pConfig->format;
      local_98.cutoffFrequency = pConfig->cutoffFrequency;
      local_98._12_4_ = 0;
      uVar2 = pConfig->channels;
      uVar6 = pConfig->sampleRate;
      local_98.q = 0.5;
      local_98.channels = uVar2;
      local_98.sampleRate = uVar6;
      if (isNew == 0) {
        mVar12 = ma_lpf1_reinit(&local_98,pLPF->pLPF1);
      }
      else if (uVar2 != 0) {
        mVar12 = ma_lpf1_init_preallocated
                           (&local_98,(void *)((long)pHeap + local_58._8_8_ + (ulong)uVar11 * 0x28),
                            pLPF->pLPF1);
      }
      else {
        mVar12 = (uint)(uVar2 != 0) * 2 + MA_INVALID_ARGS;
      }
      if (mVar12 != MA_SUCCESS) {
        return mVar12;
      }
    }
    if (1 < uVar13) {
      local_60 = (void *)((long)pHeap + local_70 * 0x40);
      local_40 = local_70 & 0xffffffff;
      lVar17 = 0;
      uVar15 = 0;
      local_64 = isNew;
      do {
        mVar10 = local_64;
        iVar8 = (int)uVar15;
        if (uVar11 == 0) {
          iVar8 = iVar8 * 2;
          uVar13 = pConfig->order * 2;
        }
        else {
          uVar13 = pConfig->order;
        }
        dVar19 = sin((-3.141592653589793 / (double)uVar13) * (double)(iVar8 + 1) +
                     1.5707963267948966);
        dVar19 = 1.0 / (dVar19 + dVar19);
        local_98.sampleRate = pConfig->sampleRate;
        local_98.cutoffFrequency = pConfig->cutoffFrequency;
        uVar18 = -(ulong)(dVar19 == 0.0);
        local_98.q = (double)(uVar18 & 0x3fe6a09edbf8b9bb | ~uVar18 & (ulong)dVar19);
        uVar3 = pConfig->format;
        uVar7 = pConfig->channels;
        local_98._12_4_ = 0;
        local_98.format = uVar3;
        local_98.channels = uVar7;
        if (mVar10 == 0) {
          mVar14 = ma_lpf2_reinit(&local_98,pLPF->pLPF2 + uVar15);
        }
        else {
          local_38 = (local_98.cutoffFrequency * 6.283185307179586) / (double)local_98.sampleRate;
          sin(local_38);
          sin(1.5707963267948966 - local_38);
          uVar18 = (ulong)local_98.channels;
          if (uVar18 != 0) {
            mVar14 = ma_lpf2_init_preallocated
                               (&local_98,(void *)((long)local_60 + uVar18 * uVar15 * 8 + local_48),
                                pLPF->pLPF2 + uVar15);
          }
          else {
            mVar14 = (uint)(uVar18 != 0) * 2 + MA_INVALID_ARGS;
          }
        }
        if (mVar14 != MA_SUCCESS) {
          if ((((uVar11 != 0) && (pmVar4 = pLPF->pLPF1, pmVar4 != (ma_lpf1 *)0x0)) &&
              (pmVar4->_ownsHeap != 0)) && (pmVar4->_pHeap != (void *)0x0)) {
            free(pmVar4->_pHeap);
          }
          mVar12 = mVar14;
          if (uVar15 != 0) {
            lVar16 = 0;
            do {
              pmVar5 = pLPF->pLPF2;
              if (((pmVar5 != (ma_lpf2 *)0x0) &&
                  (*(int *)((long)&(pmVar5->bq)._ownsHeap + lVar16) != 0)) &&
                 (__ptr = *(void **)((long)&(pmVar5->bq)._pHeap + lVar16), __ptr != (void *)0x0)) {
                free(__ptr);
              }
              lVar16 = lVar16 + 0x40;
            } while (lVar17 != lVar16);
          }
        }
        if (mVar14 != MA_SUCCESS) {
          return mVar12;
        }
        uVar15 = uVar15 + 1;
        lVar17 = lVar17 + 0x40;
      } while (uVar15 != local_40);
    }
    pLPF->lpf1Count = uVar11;
    pLPF->lpf2Count = (ma_uint32)local_70;
    mVar9 = pConfig->channels;
    pLPF->format = pConfig->format;
    pLPF->channels = mVar9;
    pLPF->sampleRate = pConfig->sampleRate;
    mVar12 = MA_SUCCESS;
  }
  else {
LAB_00139c15:
    mVar12 = MA_INVALID_OPERATION;
  }
  return mVar12;
}

Assistant:

static ma_result ma_lpf_reinit__internal(const ma_lpf_config* pConfig, void* pHeap, ma_lpf* pLPF, ma_bool32 isNew)
{
    ma_result result;
    ma_uint32 lpf1Count;
    ma_uint32 lpf2Count;
    ma_uint32 ilpf1;
    ma_uint32 ilpf2;
    ma_lpf_heap_layout heapLayout;  /* Only used if isNew is true. */

    if (pLPF == NULL || pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Only supporting f32 and s16. */
    if (pConfig->format != ma_format_f32 && pConfig->format != ma_format_s16) {
        return MA_INVALID_ARGS;
    }

    /* The format cannot be changed after initialization. */
    if (pLPF->format != ma_format_unknown && pLPF->format != pConfig->format) {
        return MA_INVALID_OPERATION;
    }

    /* The channel count cannot be changed after initialization. */
    if (pLPF->channels != 0 && pLPF->channels != pConfig->channels) {
        return MA_INVALID_OPERATION;
    }

    if (pConfig->order > MA_MAX_FILTER_ORDER) {
        return MA_INVALID_ARGS;
    }

    ma_lpf_calculate_sub_lpf_counts(pConfig->order, &lpf1Count, &lpf2Count);

    /* The filter order can't change between reinits. */
    if (!isNew) {
        if (pLPF->lpf1Count != lpf1Count || pLPF->lpf2Count != lpf2Count) {
            return MA_INVALID_OPERATION;
        }
    }

    if (isNew) {
        result = ma_lpf_get_heap_layout(pConfig, &heapLayout);
        if (result != MA_SUCCESS) {
            return result;
        }

        pLPF->_pHeap = pHeap;
        MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

        pLPF->pLPF1 = (ma_lpf1*)ma_offset_ptr(pHeap, heapLayout.lpf1Offset);
        pLPF->pLPF2 = (ma_lpf2*)ma_offset_ptr(pHeap, heapLayout.lpf2Offset);
    } else {
        MA_ZERO_OBJECT(&heapLayout);    /* To silence a compiler warning. */
    }

    for (ilpf1 = 0; ilpf1 < lpf1Count; ilpf1 += 1) {
        ma_lpf1_config lpf1Config = ma_lpf1_config_init(pConfig->format, pConfig->channels, pConfig->sampleRate, pConfig->cutoffFrequency);

        if (isNew) {
            size_t lpf1HeapSizeInBytes;

            result = ma_lpf1_get_heap_size(&lpf1Config, &lpf1HeapSizeInBytes);
            if (result == MA_SUCCESS) {
                result = ma_lpf1_init_preallocated(&lpf1Config, ma_offset_ptr(pHeap, heapLayout.lpf1Offset + (sizeof(ma_lpf1) * lpf1Count) + (ilpf1 * lpf1HeapSizeInBytes)), &pLPF->pLPF1[ilpf1]);
            }
        } else {
            result = ma_lpf1_reinit(&lpf1Config, &pLPF->pLPF1[ilpf1]);
        }

        if (result != MA_SUCCESS) {
            ma_uint32 jlpf1;

            for (jlpf1 = 0; jlpf1 < ilpf1; jlpf1 += 1) {
                ma_lpf1_uninit(&pLPF->pLPF1[jlpf1], NULL);  /* No need for allocation callbacks here since we used a preallocated heap allocation. */
            }

            return result;
        }
    }

    for (ilpf2 = 0; ilpf2 < lpf2Count; ilpf2 += 1) {
        ma_lpf2_config lpf2Config;
        double q;
        double a;

        /* Tempting to use 0.707107, but won't result in a Butterworth filter if the order is > 2. */
        if (lpf1Count == 1) {
            a = (1 + ilpf2*1) * (MA_PI_D/(pConfig->order*1));   /* Odd order. */
        } else {
            a = (1 + ilpf2*2) * (MA_PI_D/(pConfig->order*2));   /* Even order. */
        }
        q = 1 / (2*ma_cosd(a));

        lpf2Config = ma_lpf2_config_init(pConfig->format, pConfig->channels, pConfig->sampleRate, pConfig->cutoffFrequency, q);

        if (isNew) {
            size_t lpf2HeapSizeInBytes;

            result = ma_lpf2_get_heap_size(&lpf2Config, &lpf2HeapSizeInBytes);
            if (result == MA_SUCCESS) {
                result = ma_lpf2_init_preallocated(&lpf2Config, ma_offset_ptr(pHeap, heapLayout.lpf2Offset + (sizeof(ma_lpf2) * lpf2Count) + (ilpf2 * lpf2HeapSizeInBytes)), &pLPF->pLPF2[ilpf2]);
            }
        } else {
            result = ma_lpf2_reinit(&lpf2Config, &pLPF->pLPF2[ilpf2]);
        }

        if (result != MA_SUCCESS) {
            ma_uint32 jlpf1;
            ma_uint32 jlpf2;

            for (jlpf1 = 0; jlpf1 < lpf1Count; jlpf1 += 1) {
                ma_lpf1_uninit(&pLPF->pLPF1[jlpf1], NULL);  /* No need for allocation callbacks here since we used a preallocated heap allocation. */
            }

            for (jlpf2 = 0; jlpf2 < ilpf2; jlpf2 += 1) {
                ma_lpf2_uninit(&pLPF->pLPF2[jlpf2], NULL);  /* No need for allocation callbacks here since we used a preallocated heap allocation. */
            }

            return result;
        }
    }

    pLPF->lpf1Count  = lpf1Count;
    pLPF->lpf2Count  = lpf2Count;
    pLPF->format     = pConfig->format;
    pLPF->channels   = pConfig->channels;
    pLPF->sampleRate = pConfig->sampleRate;

    return MA_SUCCESS;
}